

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::ClipperOffset::OffsetPoint(ClipperOffset *this,int j,int *k,JoinType jointype)

{
  pointer *ppIVar1;
  Path *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pDVar5;
  pointer pIVar6;
  iterator iVar7;
  cInt cVar8;
  int iVar9;
  IntPoint *__args;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  IntPoint local_40;
  double local_30;
  
  iVar9 = *k;
  pDVar5 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar14 = pDVar5[iVar9].X;
  dVar11 = pDVar5[iVar9].Y;
  dVar2 = pDVar5[j].X;
  dVar3 = pDVar5[j].Y;
  dVar12 = dVar14 * dVar3 - dVar11 * dVar2;
  this->m_sinA = dVar12;
  dVar4 = this->m_delta;
  dVar13 = 1.0;
  if (1.0 <= ABS(dVar12 * dVar4)) {
    if ((1.0 < dVar12) || (dVar13 = -1.0, dVar12 < -1.0)) {
      this->m_sinA = dVar13;
    }
  }
  else {
    dVar14 = dVar14 * dVar2 + dVar3 * dVar11;
    if (0.0 < dVar14) {
      pIVar6 = (this->m_srcPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar11 = pDVar5[iVar9].X * dVar4 + (double)pIVar6[j].X;
      uVar10 = -(ulong)(dVar11 < 0.0);
      local_40.X = (cInt)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) +
                         dVar11);
      dVar11 = dVar4 * pDVar5[iVar9].Y + (double)pIVar6[j].Y;
      uVar10 = -(ulong)(dVar11 < 0.0);
      local_40.Y = (cInt)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) +
                         dVar11);
      iVar7._M_current =
           (this->m_destPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->m_destPoly).
          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_30 = dVar14;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar7,&local_40);
        dVar14 = local_30;
      }
      else {
        (iVar7._M_current)->X = local_40.X;
        (iVar7._M_current)->Y = local_40.Y;
        ppIVar1 = &(this->m_destPoly).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      if (0.0 < dVar14) {
        return;
      }
    }
  }
  dVar14 = this->m_delta;
  if (this->m_sinA * dVar14 < 0.0) {
    pIVar6 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pDVar5 = (this->m_normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar11 = pDVar5[*k].X * dVar14 + (double)pIVar6[j].X;
    uVar10 = -(ulong)(dVar11 < 0.0);
    local_40.X = (cInt)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) +
                       dVar11);
    this_00 = &this->m_destPoly;
    dVar14 = dVar14 * pDVar5[*k].Y + (double)pIVar6[j].Y;
    uVar10 = -(ulong)(dVar14 < 0.0);
    local_40.Y = (cInt)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) +
                       dVar14);
    iVar7._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
      _M_realloc_insert<ClipperLib::IntPoint>(this_00,iVar7,&local_40);
    }
    else {
      (iVar7._M_current)->X = local_40.X;
      (iVar7._M_current)->Y = local_40.Y;
      ppIVar1 = &(this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    __args = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start + j;
    iVar7._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
      _M_realloc_insert<ClipperLib::IntPoint_const&>
                ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this_00,iVar7,
                 __args);
    }
    else {
      cVar8 = __args->Y;
      (iVar7._M_current)->X = __args->X;
      (iVar7._M_current)->Y = cVar8;
      ppIVar1 = &(this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    pIVar6 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pDVar5 = (this->m_normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar14 = pDVar5[j].X * this->m_delta + (double)pIVar6[j].X;
    uVar10 = -(ulong)(dVar14 < 0.0);
    local_40.X = (cInt)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) +
                       dVar14);
    dVar14 = this->m_delta * pDVar5[j].Y + (double)pIVar6[j].Y;
    uVar10 = -(ulong)(dVar14 < 0.0);
    local_40.Y = (cInt)((double)(~uVar10 & 0x3fe0000000000000 | uVar10 & 0xbfe0000000000000) +
                       dVar14);
    iVar7._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
      _M_realloc_insert<ClipperLib::IntPoint>(this_00,iVar7,&local_40);
    }
    else {
      (iVar7._M_current)->X = local_40.X;
      (iVar7._M_current)->Y = local_40.Y;
      ppIVar1 = &(this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    goto LAB_00115d51;
  }
  if (jointype == jtSquare) {
    iVar9 = *k;
  }
  else {
    if (jointype == jtRound) {
      DoRound(this,j,*k);
      goto LAB_00115d51;
    }
    if (jointype != jtMiter) goto LAB_00115d51;
    pDVar5 = (this->m_normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar9 = *k;
    dVar14 = pDVar5[j].X * pDVar5[iVar9].X + pDVar5[j].Y * pDVar5[iVar9].Y + 1.0;
    if (this->m_miterLim <= dVar14) {
      DoMiter(this,j,iVar9,dVar14);
      goto LAB_00115d51;
    }
  }
  DoSquare(this,j,iVar9);
LAB_00115d51:
  *k = j;
  return;
}

Assistant:

void ClipperOffset::OffsetPoint(int j, int& k, JoinType jointype)
{
  //cross product ...
  m_sinA = (m_normals[k].X * m_normals[j].Y - m_normals[j].X * m_normals[k].Y);
  if (std::fabs(m_sinA * m_delta) < 1.0) 
  {
    //dot product ...
    double cosA = (m_normals[k].X * m_normals[j].X + m_normals[j].Y * m_normals[k].Y ); 
    if (cosA > 0) // angle => 0 degrees
    {
      m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
        Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
      return; 
    }
    //else angle => 180 degrees   
  }
  else if (m_sinA > 1.0) m_sinA = 1.0;
  else if (m_sinA < -1.0) m_sinA = -1.0;

  if (m_sinA * m_delta < 0)
  {
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
    m_destPoly.push_back(m_srcPoly[j]);
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
  }
  else
    switch (jointype)
    {
      case jtMiter:
        {
          double r = 1 + (m_normals[j].X * m_normals[k].X +
            m_normals[j].Y * m_normals[k].Y);
          if (r >= m_miterLim) DoMiter(j, k, r); else DoSquare(j, k);
          break;
        }
      case jtSquare: DoSquare(j, k); break;
      case jtRound: DoRound(j, k); break;
    }
  k = j;
}